

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

LineDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  LineDirectiveSyntax *pLVar21;
  
  pLVar21 = (LineDirectiveSyntax *)allocate(this,0x58,8);
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar1 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar17 = args_3->kind;
  uVar18 = args_3->field_0x2;
  NVar19.raw = (args_3->numFlags).raw;
  uVar20 = args_3->rawLen;
  pIVar4 = args_3->info;
  (pLVar21->super_DirectiveSyntax).super_SyntaxNode.kind = LineDirective;
  (pLVar21->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pLVar21->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pLVar21->super_DirectiveSyntax).directive.kind = TVar5;
  (pLVar21->super_DirectiveSyntax).directive.field_0x2 = uVar6;
  (pLVar21->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar7.raw;
  (pLVar21->super_DirectiveSyntax).directive.rawLen = uVar8;
  (pLVar21->super_DirectiveSyntax).directive.info = pIVar1;
  (pLVar21->lineNumber).kind = TVar9;
  (pLVar21->lineNumber).field_0x2 = uVar10;
  (pLVar21->lineNumber).numFlags = (NumericTokenFlags)NVar11.raw;
  (pLVar21->lineNumber).rawLen = uVar12;
  (pLVar21->lineNumber).info = pIVar2;
  (pLVar21->fileName).kind = TVar13;
  (pLVar21->fileName).field_0x2 = uVar14;
  (pLVar21->fileName).numFlags = (NumericTokenFlags)NVar15.raw;
  (pLVar21->fileName).rawLen = uVar16;
  (pLVar21->fileName).info = pIVar3;
  (pLVar21->level).kind = TVar17;
  (pLVar21->level).field_0x2 = uVar18;
  (pLVar21->level).numFlags = (NumericTokenFlags)NVar19.raw;
  (pLVar21->level).rawLen = uVar20;
  (pLVar21->level).info = pIVar4;
  return pLVar21;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }